

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-nodes.cc
# Opt level: O1

void __thiscall cnn::LookupNode::accumulate_grad(LookupNode *this,Tensor *g)

{
  uint index;
  LookupParameters *this_00;
  bool bVar1;
  ulong uVar2;
  pointer puVar3;
  ulong uVar4;
  ulong uVar5;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> local_30;
  
  if (this->pindex != (uint *)0x0) {
    LookupParameters::accumulate_grad(this->params,*this->pindex,g);
    return;
  }
  if (this->pindices != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    Tensor::batch_elems(&local_30,g);
    puVar3 = (this->pindices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->pindices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar3) {
      uVar2 = 0;
      uVar5 = 1;
      do {
        index = puVar3[uVar2];
        this_00 = this->params;
        uVar4 = ((long)(this_00->values).
                       super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this_00->values).
                       super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
        if (uVar4 < index || uVar4 - index == 0) {
          __assert_fail("i < params->values.size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/param-nodes.cc"
                        ,0xb0,"virtual void cnn::LookupNode::accumulate_grad(const Tensor &)");
        }
        LookupParameters::accumulate_grad
                  (this_00,index,
                   local_30.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar2);
        puVar3 = (this->pindices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        bVar1 = uVar5 < (ulong)((long)(this->pindices->
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >>
                               2);
        uVar2 = uVar5;
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (bVar1);
    }
    std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_30);
    return;
  }
  __assert_fail("pindices",
                "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/param-nodes.cc"
                ,0xac,"virtual void cnn::LookupNode::accumulate_grad(const Tensor &)");
}

Assistant:

void LookupNode::accumulate_grad(const Tensor& g) {
  if(pindex) {
    params->accumulate_grad(*pindex, g);
  } else {
    assert (pindices);
    const vector<Tensor>& gb = g.batch_elems();
    for (unsigned b = 0; b < pindices->size(); ++b) {
      unsigned i = pindices->at(b);
      assert (i < params->values.size());
      params->accumulate_grad(i, gb[b]);
    }
  }
}